

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_parser.c
# Opt level: O3

gnode_t * parse_compound_statement(gravity_parser_t *parser)

{
  gravity_lexer_t *lexer;
  gtoken_s token_00;
  _Bool _Var1;
  gtoken_t gVar2;
  uint uVar3;
  gnode_r *stmts;
  gnode_t *pgVar4;
  gnode_t **__ptr;
  size_t sVar5;
  size_t sVar6;
  gtoken_s token;
  gtoken_s end_token;
  undefined8 local_a0;
  undefined4 uStack_98;
  int iStack_94;
  undefined8 local_90;
  undefined8 uStack_88;
  char *local_80;
  int local_6c;
  int local_64;
  
  parse_required(parser,TOK_OP_OPEN_CURLYBRACE);
  lexer = parser->lexer->p[parser->lexer->n - 1];
  gravity_lexer_token(lexer);
  stmts = gnode_array_create();
  gVar2 = gravity_lexer_peek(lexer);
  _Var1 = token_isstatement(gVar2);
  if (_Var1) {
    do {
      uVar3 = parser->depth + 1;
      parser->depth = uVar3;
      if (1000 < uVar3) {
        gravity_lexer_token(lexer);
        report_error(parser,GRAVITY_ERROR_SYNTAX,0x13fb42);
        return (gnode_t *)0x0;
      }
      pgVar4 = parse_statement(parser);
      if (pgVar4 != (gnode_t *)0x0) {
        sVar5 = stmts->n;
        __ptr = stmts->p;
        if (sVar5 == stmts->m) {
          sVar6 = sVar5 * 2;
          if (sVar5 == 0) {
            sVar6 = 8;
          }
          stmts->m = sVar6;
          __ptr = (gnode_t **)realloc(__ptr,sVar6 << 3);
          stmts->p = __ptr;
          sVar5 = stmts->n;
        }
        stmts->n = sVar5 + 1;
        __ptr[sVar5] = pgVar4;
      }
      parser->depth = parser->depth - 1;
      gVar2 = gravity_lexer_peek(lexer);
      _Var1 = token_isstatement(gVar2);
    } while (_Var1);
  }
  parse_required(parser,TOK_OP_CLOSED_CURLYBRACE);
  gravity_lexer_token(lexer);
  sVar5 = parser->declarations->n;
  if (sVar5 == 0) {
    pgVar4 = (gnode_t *)0x0;
  }
  else {
    pgVar4 = parser->declarations->p[sVar5 - 1];
  }
  token_00.colno = uStack_98;
  token_00._0_8_ = local_a0;
  token_00.position = iStack_94;
  token_00.bytes = (int)local_90;
  token_00.length = (int)((ulong)local_90 >> 0x20);
  token_00.fileid = (int)uStack_88;
  token_00.builtin = (int)((ulong)uStack_88 >> 0x20);
  token_00.value = local_80;
  pgVar4 = gnode_block_stat_create
                     (NODE_COMPOUND_STAT,token_00,stmts,pgVar4,(local_64 + local_6c) - iStack_94);
  return pgVar4;
}

Assistant:

static gnode_t *parse_compound_statement (gravity_parser_t *parser) {
    DEBUG_PARSER("parse_compound_statement");

    // '{' (statement+)? '}'

    // check and consume TOK_OP_OPEN_CURLYBRACE
    parse_required(parser, TOK_OP_OPEN_CURLYBRACE);

    DECLARE_LEXER;
    gtoken_s token = gravity_lexer_token(lexer);
    gnode_r *stmts = gnode_array_create();
    while (token_isstatement(gravity_lexer_peek(lexer))) {
        if (++parser->depth > MAX_RECURSION_DEPTH) {
            REPORT_ERROR(gravity_lexer_token(lexer), "Maximum statement recursion depth reached.");
            return NULL;
        }
        gnode_t *node = parse_statement(parser);
        if (node) gnode_array_push(stmts, node);
        --parser->depth;
    }

    // check and consume TOK_OP_CLOSED_CURLYBRACE
    parse_required(parser, TOK_OP_CLOSED_CURLYBRACE);

	// read current token to extract node total length
	gtoken_s end_token = gravity_lexer_token(lexer);

    return gnode_block_stat_create(NODE_COMPOUND_STAT, token, stmts, LAST_DECLARATION(), end_token.position + end_token.length - token.position);
}